

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

void __thiscall chaiscript::eval::Noop_AST_Node::Noop_AST_Node(Noop_AST_Node *this)

{
  string *in_RDI;
  undefined8 in_stack_ffffffffffffff38;
  string *this_00;
  allocator *t_children;
  Parse_Location *this_01;
  int t_id;
  string *t_ast_node_text;
  AST_Node *this_02;
  allocator local_81;
  string local_80 [87];
  undefined1 local_29 [41];
  
  this_01 = (Parse_Location *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"",(allocator *)this_01);
  t_children = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",t_children);
  Parse_Location::Parse_Location
            (this_01,in_RDI,(int)((ulong)t_children >> 0x20),(int)t_children,
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38);
  t_id = (int)((ulong)this_01 >> 0x20);
  t_ast_node_text = (string *)0x0;
  this_02 = (AST_Node *)0x0;
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::vector((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
            *)0x26d8fc);
  this_00 = (string *)(local_29 + 1);
  AST_Node::AST_Node(this_02,t_ast_node_text,t_id,(Parse_Location *)in_RDI,
                     (vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                      *)t_children);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::~vector((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             *)t_children);
  Parse_Location::~Parse_Location((Parse_Location *)0x26d939);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  *(undefined ***)in_RDI = &PTR_pretty_print_abi_cxx11__005c15e0;
  const_var(SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

Noop_AST_Node() :
          AST_Node("", AST_Node_Type::Noop, Parse_Location()),
          m_value(const_var(true))
        { }